

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcLoadModuleByBinary(char *module,char *binary)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  nullres nVar7;
  uint uVar8;
  TraceScope traceScope;
  char path [1024];
  TraceScope TStack_438;
  char local_428 [1024];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    return '\0';
  }
  if ((nullcLoadModuleByBinary::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&nullcLoadModuleByBinary::token), iVar4 != 0)) {
    nullcLoadModuleByBinary::token = NULLC::TraceGetToken("nullc","nullcLoadModuleByBinary");
    __cxa_guard_release(&nullcLoadModuleByBinary::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_438,nullcLoadModuleByBinary::token);
  lVar3 = NULLC::traceContext;
  sVar5 = strlen(module);
  uVar8 = (int)sVar5 + 1;
  if ((*(uint *)(lVar3 + 0x264) <= *(int *)(lVar3 + 0x260) + uVar8) ||
     (*(int *)(lVar3 + 0x270) == *(int *)(lVar3 + 0x274))) {
    NULLC::TraceDump();
  }
  if (*(uint *)(lVar3 + 0x264) <= uVar8) {
    __assert_fail("count < context.labels.max",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                  ,0x127,"void NULLC::TraceLabel(const char *)");
  }
  uVar1 = *(uint *)(lVar3 + 0x260);
  memcpy((void *)((ulong)uVar1 + *(long *)(lVar3 + 0x268)),module,(ulong)uVar8);
  *(int *)(lVar3 + 0x260) = *(int *)(lVar3 + 0x260) + uVar8;
  lVar2 = *(long *)(lVar3 + 0x278);
  uVar8 = *(uint *)(lVar3 + 0x270);
  *(uint *)(lVar3 + 0x270) = uVar8 + 1;
  *(uint *)(lVar2 + (ulong)uVar8 * 8) = uVar1 * 4 + 2;
  *(undefined4 *)(lVar2 + 4 + (ulong)uVar8 * 8) = 0;
  sVar5 = strlen(module);
  if (sVar5 < 0x201) {
    strcpy(local_428,module);
    if (local_428[0] != '\0') {
      pcVar6 = local_428;
      do {
        pcVar6 = pcVar6 + 1;
        if (local_428[0] == '.') {
          pcVar6[-1] = '/';
        }
        local_428[0] = *pcVar6;
      } while (local_428[0] != '\0');
    }
    sVar5 = strlen(local_428);
    builtin_strncpy(local_428 + sVar5,".nc",4);
    pcVar6 = BinaryCache::GetBytecode(local_428);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (char *)(*(code *)NULLC::alloc)(*(undefined4 *)binary);
      memcpy(pcVar6,binary,(ulong)*(uint *)binary);
      nVar7 = '\x01';
      BinaryCache::PutBytecode(local_428,pcVar6,(Lexeme *)0x0,0);
      goto LAB_0010d316;
    }
    NULLC::nullcLastError = "ERROR: module already loaded";
  }
  else {
    NULLC::nullcLastError = "ERROR: module name is too long";
  }
  nVar7 = '\0';
LAB_0010d316:
  NULLC::TraceScope::~TraceScope(&TStack_438);
  return nVar7;
}

Assistant:

nullres nullcLoadModuleByBinary(const char* module, const char* binary)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleByBinary");
	TRACE_LABEL(module);

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}
	// Duplicate binary
	char *copy = (char*)NULLC::alloc(((ByteCode*)binary)->size);
	memcpy(copy, binary, ((ByteCode*)binary)->size);
	binary = copy;
	// Load it into cache
	BinaryCache::PutBytecode(path, binary, NULL, 0);
	return 1;
}